

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O3

int rops_close_kill_connection_h1(lws *wsi,lws_close_status reason)

{
  return 0;
}

Assistant:

static int
rops_close_kill_connection_h1(struct lws *wsi, enum lws_close_status reason)
{
#if defined(LWS_WITH_HTTP_PROXY)
	if (!wsi->http.proxy_clientside)
		return 0;

	wsi->http.proxy_clientside = 0;

	if (user_callback_handle_rxflow(wsi->a.protocol->callback, wsi,
					LWS_CALLBACK_COMPLETED_CLIENT_HTTP,
					wsi->user_space, NULL, 0))
		return 0;
#endif
	return 0;
}